

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildtexture.cpp
# Opt level: O0

void __thiscall FTextureManager::AddTiles(FTextureManager *this,void *tiles)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint height_00;
  uint uVar6;
  DWORD speedrange;
  uint uVar7;
  FBuildTexture *this_00;
  long lVar8;
  long lVar9;
  FTextureID local_148;
  int local_144;
  undefined1 auStack_140 [4];
  int j_1;
  spriteframe_t rot_1;
  FTextureID local_e8;
  int local_e4;
  undefined1 auStack_e0 [4];
  int j;
  spriteframe_t rot;
  int rotType;
  DWORD local_84;
  int speed;
  int type;
  FTexture *tex;
  int local_60;
  FTextureID texnum;
  int size;
  int yoffs;
  int xoffs;
  DWORD anm;
  int height;
  int width;
  int pic;
  int i;
  BYTE *tiledata;
  DWORD *picanm;
  WORD *tilesizy;
  WORD *tilesizx;
  int tileend;
  int tilestart;
  void *tiles_local;
  FTextureManager *this_local;
  
  iVar1 = *(int *)((long)tiles + 8);
  iVar2 = *(int *)((long)tiles + 0xc);
  lVar3 = (long)((iVar2 - iVar1) + 1) * 2 + 0x10;
  lVar4 = (long)((iVar2 - iVar1) + 1) * 2 + lVar3;
  _pic = (BYTE *)((long)tiles + (long)((iVar2 - iVar1) + 1) * 4 + lVar4);
  for (width = iVar1; width <= iVar2; width = width + 1) {
    iVar5 = width - iVar1;
    uVar6 = (uint)*(ushort *)((long)tiles + (long)iVar5 * 2 + 0x10);
    height_00 = (uint)*(ushort *)((long)tiles + (long)iVar5 * 2 + lVar3);
    uVar7 = *(uint *)((long)tiles + (long)iVar5 * 4 + lVar4);
    texnum.texnum = (int)(char)(uVar7 >> 0x10) + height_00 / 2;
    local_60 = uVar6 * height_00;
    FTextureID::FTextureID((FTextureID *)((long)&tex + 4));
    if ((uVar6 != 0) && (height_00 != 0)) {
      this_00 = (FBuildTexture *)operator_new(0x68);
      FBuildTexture::FBuildTexture
                (this_00,width,_pic,uVar6,height_00,(int)(char)(uVar7 >> 8) + uVar6 / 2,
                 texnum.texnum);
      tex._4_4_ = AddTexture(this,(FTexture *)this_00);
      for (; 0 < local_60; local_60 = local_60 + -1) {
        *_pic = 0xff - *_pic;
        _pic = _pic + 1;
      }
      (*StartScreen->_vptr_FStartupScreen[2])();
      if (((*(uint *)((long)tiles + (long)iVar5 * 4 + lVar4) & 0x3f) != 0) &&
         ((*(uint *)((long)tiles + (long)iVar5 * 4 + lVar4) & 0xc0) != 0)) {
        uVar6 = *(uint *)((long)tiles + (long)iVar5 * 4 + lVar4) & 0xc0;
        if (uVar6 == 0x40) {
          local_84 = 2;
        }
        else if (uVar6 == 0x80) {
          local_84 = 0;
        }
        else if (uVar6 == 0xc0) {
          local_84 = 1;
        }
        else {
          local_84 = 0;
        }
        speedrange = MAX<int>(1,((1 << ((byte)(uVar7 >> 0x18) & 0xf)) * 1000) / 0x78);
        rot._76_4_ = tex._4_4_;
        AddSimpleAnim(this,tex._4_4_,*(uint *)((long)tiles + (long)iVar5 * 4 + lVar4) & 0x3f,
                      local_84,speedrange);
      }
      rot._72_4_ = uVar7 >> 0x1c & 7;
      if (rot._72_4_ == 1) {
        spriteframe_t::spriteframe_t((spriteframe_t *)auStack_e0);
        rot.Voxel._4_4_ = tex._4_4_;
        rot.Voxel._0_4_ = tex._4_4_;
        for (local_e4 = 1; local_e4 < 4; local_e4 = local_e4 + 1) {
          iVar5 = FTextureID::GetIndex((FTextureID *)((long)&tex + 4));
          FTextureID::FTextureID(&local_e8,iVar5 + local_e4);
          lVar9 = (long)(local_e4 * -2 + 0x11);
          rot.Texture[lVar9 + -2].texnum = local_e8.texnum;
          lVar8 = (long)(local_e4 * -2 + 0x10);
          rot.Texture[lVar8 + -2].texnum = rot.Texture[lVar9 + -2].texnum;
          lVar9 = (long)(local_e4 * 2 + 1);
          rot.Texture[lVar9 + -2].texnum = rot.Texture[lVar8 + -2].texnum;
          rot.Texture[(long)(local_e4 << 1) + -2].texnum = rot.Texture[lVar9 + -2].texnum;
        }
        iVar5 = FTextureID::GetIndex((FTextureID *)((long)&tex + 4));
        FTextureID::FTextureID((FTextureID *)&rot_1.field_0x4c,iVar5 + 4);
        rot.Texture[7].texnum = rot_1._76_4_;
        rot.Texture[6].texnum = rot_1._76_4_;
        rot.Texture[0xe].texnum._0_2_ = 0xfc;
        _auStack_e0 = (FVoxelDef *)0x0;
        uVar7 = TArray<spriteframe_t,_spriteframe_t>::Push
                          (&SpriteFrames,(spriteframe_t *)auStack_e0);
        (this_00->super_FTexture).Rotations = (WORD)uVar7;
      }
      else if (rot._72_4_ == 2) {
        spriteframe_t::spriteframe_t((spriteframe_t *)auStack_140);
        rot_1.Voxel._4_4_ = tex._4_4_;
        rot_1.Voxel._0_4_ = tex._4_4_;
        for (local_144 = 1; local_144 < 8; local_144 = local_144 + 1) {
          iVar5 = FTextureID::GetIndex((FTextureID *)((long)&tex + 4));
          FTextureID::FTextureID(&local_148,iVar5 + local_144);
          lVar8 = (long)(local_144 * -2 + 0x11);
          rot_1.Texture[lVar8 + -2].texnum = local_148.texnum;
          rot_1.Texture[(long)(local_144 * -2 + 0x10) + -2].texnum =
               rot_1.Texture[lVar8 + -2].texnum;
        }
        rot_1.Texture[0xe].texnum._0_2_ = 0;
        _auStack_140 = (FVoxelDef *)0x0;
        uVar7 = TArray<spriteframe_t,_spriteframe_t>::Push
                          (&SpriteFrames,(spriteframe_t *)auStack_140);
        (this_00->super_FTexture).Rotations = (WORD)uVar7;
      }
    }
  }
  return;
}

Assistant:

void FTextureManager::AddTiles (void *tiles)
{
//	int numtiles = LittleLong(((DWORD *)tiles)[1]);	// This value is not reliable
	int tilestart = LittleLong(((DWORD *)tiles)[2]);
	int tileend = LittleLong(((DWORD *)tiles)[3]);
	const WORD *tilesizx = &((const WORD *)tiles)[8];
	const WORD *tilesizy = &tilesizx[tileend - tilestart + 1];
	const DWORD *picanm = (const DWORD *)&tilesizy[tileend - tilestart + 1];
	BYTE *tiledata = (BYTE *)&picanm[tileend - tilestart + 1];

	for (int i = tilestart; i <= tileend; ++i)
	{
		int pic = i - tilestart;
		int width = LittleShort(tilesizx[pic]);
		int height = LittleShort(tilesizy[pic]);
		DWORD anm = LittleLong(picanm[pic]);
		int xoffs = (SBYTE)((anm >> 8) & 255) + width/2;
		int yoffs = (SBYTE)((anm >> 16) & 255) + height/2;
		int size = width*height;
		FTextureID texnum;
		FTexture *tex;

		if (width <= 0 || height <= 0) continue;

		tex = new FBuildTexture (i, tiledata, width, height, xoffs, yoffs);
		texnum = AddTexture (tex);
		while (size > 0)
		{
			*tiledata = 255 - *tiledata;
			tiledata++;
			size--;
		}
		StartScreen->Progress();

		if ((picanm[pic] & 63) && (picanm[pic] & 192))
		{
			int type, speed;

			switch (picanm[pic] & 192)
			{
			case 64:	type = 2;	break;
			case 128:	type = 0;	break;
			case 192:	type = 1;	break;
			default:    type = 0;   break;  // Won't happen, but GCC bugs me if I don't put this here.
			}

			speed = (anm >> 24) & 15;
			speed = MAX (1, (1 << speed) * 1000 / 120);	// Convert from 120 Hz to 1000 Hz.

			AddSimpleAnim (texnum, picanm[pic] & 63, type, speed);
		}

		// Blood's rotation types:
		// 0 - Single
		// 1 - 5 Full
		// 2 - 8 Full
		// 3 - Bounce (looks no different from Single; seems to signal bouncy sprites)
		// 4 - 5 Half (not used in game)
		// 5 - 3 Flat (not used in game)
		// 6 - Voxel
		// 7 - Spin Voxel

		int rotType = (anm >> 28) & 7;
		if (rotType == 1)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 4; ++j)
			{
				rot.Texture[j*2] =
				rot.Texture[j*2+1] =
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Texture[8] =
			rot.Texture[9] = texnum.GetIndex() + 4;
			rot.Flip = 0x00FC;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
		else if (rotType == 2)
		{
			spriteframe_t rot;
			rot.Texture[0] =
			rot.Texture[1] = texnum;
			for (int j = 1; j < 8; ++j)
			{
				rot.Texture[16-j*2] =
				rot.Texture[17-j*2] = texnum.GetIndex() + j;
			}
			rot.Flip = 0;
			rot.Voxel = NULL;
			tex->Rotations = SpriteFrames.Push (rot);
		}
	}
}